

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

bool slang::exactlyEqual(SVInt *lhs,SVInt *rhs)

{
  uint uVar1;
  uint uVar2;
  logic_t lVar3;
  bool bVar4;
  int iVar5;
  byte bVar6;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_20;
  uint local_18;
  byte local_13;
  
  bVar4 = (lhs->super_SVIntStorage).unknownFlag;
  if (bVar4 == false) {
    if ((rhs->super_SVIntStorage).unknownFlag == false) {
      lVar3 = SVInt::operator==(lhs,rhs);
      return (lVar3.value & 0x7f) != 0 && lVar3.value != '@';
    }
  }
  else if ((rhs->super_SVIntStorage).unknownFlag == true) {
    uVar1 = (lhs->super_SVIntStorage).bitWidth;
    uVar2 = (rhs->super_SVIntStorage).bitWidth;
    if (uVar1 == uVar2) {
      iVar5 = bcmp((lhs->super_SVIntStorage).field_0.pVal,(rhs->super_SVIntStorage).field_0.pVal,
                   (ulong)(((uVar1 + 0x3f >> 6) << (bVar4 & 0x1fU)) << 3));
      return iVar5 == 0;
    }
    bVar6 = (rhs->super_SVIntStorage).signFlag & (lhs->super_SVIntStorage).signFlag;
    if (uVar1 < uVar2) {
      if (bVar6 == 0) {
        SVInt::zext((SVInt *)&local_20,(bitwidth_t)lhs);
      }
      else {
        SVInt::sext((SVInt *)&local_20,(bitwidth_t)lhs);
      }
      bVar4 = exactlyEqual((SVInt *)&local_20,rhs);
    }
    else {
      if (bVar6 == 0) {
        SVInt::zext((SVInt *)&local_20,(bitwidth_t)rhs);
      }
      else {
        SVInt::sext((SVInt *)&local_20,(bitwidth_t)rhs);
      }
      bVar4 = exactlyEqual(lhs,(SVInt *)&local_20);
    }
    if ((local_18 < 0x41) && ((local_13 & 1) == 0)) {
      return bVar4;
    }
    if ((void *)local_20.val == (void *)0x0) {
      return bVar4;
    }
    operator_delete__(local_20.pVal);
    return bVar4;
  }
  return false;
}

Assistant:

bool exactlyEqual(const SVInt& lhs, const SVInt& rhs) {
    // if no unknown flags, do normal comparison
    if (!lhs.unknownFlag && !rhs.unknownFlag)
        return (bool)(lhs == rhs);

    // if one has unknown and the other doesn't, they're not equal
    if (!lhs.unknownFlag || !rhs.unknownFlag)
        return false;

    // handle sign extension if necessary
    if (lhs.bitWidth != rhs.bitWidth) {
        bool bothSigned = lhs.signFlag && rhs.signFlag;
        if (lhs.bitWidth < rhs.bitWidth)
            return exactlyEqual(lhs.extend(rhs.bitWidth, bothSigned), rhs);
        else
            return exactlyEqual(lhs, rhs.extend(lhs.bitWidth, bothSigned));
    }

    // ok, equal widths, and they both have unknown values, do a straight memory compare
    return memcmp(lhs.pVal, rhs.pVal, lhs.getNumWords() * SVInt::WORD_SIZE) == 0;
}